

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestAllTypes_NestedMessage * __thiscall
proto2_unittest::TestAllTypes::release_optional_nested_message(TestAllTypes *this)

{
  uint32_t *puVar1;
  Arena *pAVar2;
  TestAllTypes_NestedMessage *local_20;
  TestAllTypes_NestedMessage *released;
  TestAllTypes *this_local;
  
  puVar1 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 & 0xffffffdf;
  local_20 = (this->field_0)._impl_.optional_nested_message_;
  (this->field_0)._impl_.optional_nested_message_ = (TestAllTypes_NestedMessage *)0x0;
  pAVar2 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  if (pAVar2 != (Arena *)0x0) {
    local_20 = google::protobuf::internal::
               DuplicateIfNonNull<proto2_unittest::TestAllTypes_NestedMessage>(local_20);
  }
  return local_20;
}

Assistant:

TestAllTypes::release_optional_nested_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);

  _impl_._has_bits_[0] &= ~0x00000020u;
  ::proto2_unittest::TestAllTypes_NestedMessage* released = _impl_.optional_nested_message_;
  _impl_.optional_nested_message_ = nullptr;
  if (::google::protobuf::internal::DebugHardenForceCopyInRelease()) {
    auto* old = reinterpret_cast<::google::protobuf::MessageLite*>(released);
    released = ::google::protobuf::internal::DuplicateIfNonNull(released);
    if (GetArena() == nullptr) {
      delete old;
    }
  } else {
    if (GetArena() != nullptr) {
      released = ::google::protobuf::internal::DuplicateIfNonNull(released);
    }
  }
  return released;
}